

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringstream.h
# Opt level: O0

ParseLocation * __thiscall embree::StringStream::location(StringStream *this)

{
  ParseLocation *in_RDI;
  Stream<int> *in_stack_00000058;
  ParseLocation *this_00;
  
  this_00 = in_RDI;
  Stream<int>::loc(in_stack_00000058);
  ParseLocation::ParseLocation(this_00,in_RDI);
  return this_00;
}

Assistant:

ParseLocation location() { return cin->loc(); }